

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricDistributionPoint::IfcElectricDistributionPoint
          (IfcElectricDistributionPoint *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_008a0070;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcElectricDistributionPoint";
  Schema_2x3::IfcFlowController::IfcFlowController
            (&this->super_IfcFlowController,&PTR_construction_vtable_24__0094f208);
  *(undefined8 *)&(this->super_IfcFlowController).field_0x170 = 0;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x94f088;
  *(undefined8 *)&this->field_0x1c0 = 0x94f1f0;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 = 0x94f0b0;
  (this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x94f0d8;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 = 0x94f100;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x94f128;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.field_0x138 = 0x94f150;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.field_0x148 = 0x94f178;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    field_0x158 = 0x94f1a0;
  *(undefined8 *)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.field_0x168 =
       0x94f1c8;
  *(undefined1 **)&(this->super_IfcFlowController).field_0x178 = &this->field_0x188;
  *(undefined8 *)&this->field_0x180 = 0;
  this->field_0x188 = 0;
  (this->UserDefinedFunction).ptr._M_dataplus._M_p =
       (pointer)&(this->UserDefinedFunction).ptr.field_2;
  (this->UserDefinedFunction).ptr._M_string_length = 0;
  (this->UserDefinedFunction).ptr.field_2._M_local_buf[0] = '\0';
  (this->UserDefinedFunction).have = false;
  return;
}

Assistant:

IfcElectricDistributionPoint() : Object("IfcElectricDistributionPoint") {}